

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O0

RotationYY<std::complex<double>_> *
qclab::qgates::operator*
          (RotationYY<std::complex<double>_> *__return_storage_ptr__,
          RotationYY<std::complex<double>_> *lhs,RotationYY<std::complex<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  RotationYY<std::complex<double>_> *rhs_local;
  RotationYY<std::complex<double>_> *lhs_local;
  
  iVar1 = QRotationGate2<std::complex<double>_>::qubit
                    (&lhs->super_QRotationGate2<std::complex<double>_>);
  iVar2 = (*(rhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationYY<std::complex<double>_>::operator*=(lhs,rhs);
    RotationYY<std::complex<double>_>::RotationYY(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationYY.hpp"
                ,0xca,"RotationYY<T> qclab::qgates::operator*(RotationYY<T>, const RotationYY<T> &)"
               );
}

Assistant:

RotationYY< T > operator*( RotationYY< T > lhs ,
                                         const RotationYY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }